

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O3

void device_reset_iremga20(void *info)

{
  *(undefined8 *)((long)info + 0x55) = 0;
  *(undefined8 *)((long)info + 0x5d) = 0;
  *(undefined8 *)((long)info + 0x4c) = 0;
  *(undefined8 *)((long)info + 0x54) = 0;
  *(undefined8 *)((long)info + 0x68) = 0;
  *(undefined8 *)((long)info + 0x70) = 0;
  *(undefined8 *)((long)info + 0x71) = 0;
  *(undefined8 *)((long)info + 0x79) = 0;
  *(undefined8 *)((long)info + 0x84) = 0;
  *(undefined8 *)((long)info + 0x8c) = 0;
  *(undefined8 *)((long)info + 0x8d) = 0;
  *(undefined8 *)((long)info + 0x95) = 0;
  *(undefined8 *)((long)info + 0xa0) = 0;
  *(undefined8 *)((long)info + 0xa8) = 0;
  *(undefined8 *)((long)info + 0xa9) = 0;
  *(undefined8 *)((long)info + 0xb1) = 0;
  *(undefined8 *)((long)info + 0x2c) = 0;
  *(undefined8 *)((long)info + 0x34) = 0;
  *(undefined8 *)((long)info + 0x3c) = 0;
  *(undefined8 *)((long)info + 0x44) = 0;
  return;
}

Assistant:

static void device_reset_iremga20(void *info)
{
	ga20_state *chip = (ga20_state *)info;
	int i;

	for( i = 0; i < 4; i++ ) {
		chip->channel[i].start = 0;
		chip->channel[i].end = 0;
		chip->channel[i].pos = 0;
		chip->channel[i].frac = 0;
		chip->channel[i].fracrate = 0;
		chip->channel[i].volume = 0;
		chip->channel[i].rate = 0;
		chip->channel[i].counter = 0;
		chip->channel[i].play = 0;
	}

	memset(chip->regs, 0x00, 0x20 * sizeof(UINT8));
}